

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O1

filtration_entry_t __thiscall
tournser::
add_coboundary_and_get_pivot<priority_queue_t<std::vector<filtration_entry_t,std::allocator<filtration_entry_t>>,greater_filtration_or_smaller_index<filtration_entry_t>>,std::_Deque_iterator<filtration_entry_t,filtration_entry_t_const&,filtration_entry_t_const*>>
          (tournser *this,
          _Deque_iterator<filtration_entry_t,_const_filtration_entry_t_&,_const_filtration_entry_t_*>
          *column_begin,
          _Deque_iterator<filtration_entry_t,_const_filtration_entry_t_&,_const_filtration_entry_t_*>
          *column_end,
          priority_queue_t<std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
          *working_coboundary,index_t *dim,
          priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_smaller_index<filtration_entry_t>_>
          *reduction_column)

{
  pointer pfVar1;
  delta_complex_t *pdVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  _Elt_pointer pfVar6;
  ulong uVar7;
  long *plVar8;
  ulong uVar9;
  float fVar10;
  undefined4 uVar11;
  filtration_entry_t fVar12;
  filtration_entry_t simplex;
  filtration_entry_t coface;
  _Map_pointer local_98;
  _Elt_pointer local_90;
  pair<float,_long> local_58;
  filtration_entry_t local_40;
  
  pfVar6 = column_begin->_M_cur;
  if (pfVar6 != column_end->_M_cur) {
    local_90 = column_begin->_M_last;
    local_98 = column_begin->_M_node;
    uVar7 = 0;
    do {
      local_58.first = (pfVar6->super_pair<float,_long>).first;
      local_58._4_4_ = *(undefined4 *)&(pfVar6->super_pair<float,_long>).field_0x4;
      local_58.second = (pfVar6->super_pair<float,_long>).second;
      std::
      priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_smaller_index<filtration_entry_t>_>
      ::push(reduction_column,(value_type *)&local_58);
      pfVar1 = (this->coface_entries).
               super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->coface_entries).
          super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
          super__Vector_impl_data._M_finish != pfVar1) {
        (this->coface_entries).
        super__Vector_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
        super__Vector_impl_data._M_finish = pfVar1;
      }
      lVar5 = *dim;
      pdVar2 = this->complex;
      lVar4 = local_58.second * 0xe8;
      lVar3 = *(long *)&(pdVar2->cells).
                        super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar5].
                        super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
      ;
      if (*(long *)(lVar3 + 8 + lVar4) != *(long *)(lVar3 + lVar4)) {
        plVar8 = (long *)(lVar3 + lVar4);
        uVar9 = 0;
        do {
          local_40.super_pair<float,_long>.second = *(long *)(*plVar8 + uVar9 * 8);
          local_40.super_pair<float,_long>.first =
               (float)(long)*(float *)(*(long *)&(pdVar2->cells).
                                                 super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start
                                                 [lVar5 + 1].
                                                 super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                                       + 0x70 + local_40.super_pair<float,_long>.second * 0xe8);
          uVar9 = uVar9 + 1;
          priority_queue_t<std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
          ::push(working_coboundary,&local_40);
        } while (uVar9 < (ulong)(plVar8[1] - *plVar8 >> 3));
        uVar7 = uVar7 + uVar9;
      }
      if (this->max_entries < uVar7) {
        lVar5 = -2;
        fVar10 = 0.0;
        uVar11 = 0;
        goto LAB_0011f37a;
      }
      pfVar6 = pfVar6 + 1;
      if (pfVar6 == local_90) {
        pfVar6 = local_98[1];
        local_98 = local_98 + 1;
        local_90 = pfVar6 + 0x20;
      }
    } while (pfVar6 != column_end->_M_cur);
  }
  fVar12 = priority_queue_t<std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
           ::get_pivot(working_coboundary);
  lVar5 = fVar12.super_pair<float,_long>.second;
  fVar10 = fVar12.super_pair<float,_long>.first;
  uVar11 = fVar12.super_pair<float,_long>._4_4_;
LAB_0011f37a:
  fVar12.super_pair<float,_long>._4_4_ = uVar11;
  fVar12.super_pair<float,_long>.first = fVar10;
  fVar12.super_pair<float,_long>.second = lVar5;
  return (filtration_entry_t)fVar12.super_pair<float,_long>;
}

Assistant:

filtration_entry_t tournser::add_coboundary_and_get_pivot(
    Iterator column_begin, Iterator column_end,
    Column& working_coboundary, const index_t& dim,
    std::priority_queue<filtration_entry_t, std::deque<filtration_entry_t>, smaller_index<filtration_entry_t>>& reduction_column) {
	index_t iterations = 0;
	for (auto it = column_begin; it != column_end; ++it) {
		filtration_entry_t simplex = *it;

        reduction_column.push(simplex);

		coface_entries.clear();
		simplex_coboundary_enumerator cofaces(simplex, dim, complex);
		while (cofaces.has_next()) {
			filtration_entry_t coface = cofaces.next();

            iterations++;
            working_coboundary.push(coface);
		}
		if (iterations > max_entries) {
			return filtration_entry_t(0,-2);
		}
	}

	return working_coboundary.get_pivot();
}